

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_fwd_hrefk(jit_State *J)

{
  IRType1 *pIVar1;
  ushort uVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  TRef TVar5;
  char cVar6;
  TRef unaff_EBP;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  
  uVar2 = (J->fold).left[0].field_0.op1;
  uVar8 = (uint)J->chain[0x3b];
  do {
    if (uVar8 <= uVar2) {
      if (*(char *)((long)(J->cur).ir + (ulong)uVar2 * 8 + 5) == 'R') {
        pIVar1 = &(J->fold).ins.field_1.t;
        pIVar1->irt = pIVar1->irt & 0x7f;
      }
      goto LAB_00125c54;
    }
    pIVar3 = (J->cur).ir;
    uVar7 = (ulong)uVar8;
    if (uVar2 == pIVar3[uVar7].field_0.op1) {
      bVar9 = (J->fold).right[0].field_0.op1 != *(IRRef1 *)((long)pIVar3 + uVar7 * 8 + 2);
      if (!bVar9) {
        unaff_EBP = uVar8;
      }
      cVar6 = bVar9 * '\x03' + '\x01';
    }
    else {
      AVar4 = aa_table(J,(uint)uVar2,(uint)pIVar3[uVar7].field_0.op1);
      cVar6 = '\x04';
      if (AVar4 == ALIAS_NO) {
        uVar8 = (uint)*(ushort *)((long)pIVar3 + uVar7 * 8 + 6);
        cVar6 = '\0';
      }
    }
  } while (cVar6 == '\0');
  if (cVar6 != '\x04') {
    return unaff_EBP;
  }
LAB_00125c54:
  TVar5 = lj_opt_cse(J);
  return TVar5;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_hrefk(jit_State *J)
{
  IRRef tab = fleft->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > tab) {
    IRIns *newref = IR(ref);
    if (tab == newref->op1) {
      if (fright->op1 == newref->op2)
	return ref;  /* Forward from NEWREF. */
      else
	goto docse;
    } else if (aa_table(J, tab, newref->op1) != ALIAS_NO) {
      goto docse;
    }
    ref = newref->prev;
  }
  /* No conflicting NEWREF: key location unchanged for HREFK of TDUP. */
  if (IR(tab)->o == IR_TDUP)
    fins->t.irt &= ~IRT_GUARD;  /* Drop HREFK guard. */
docse:
  return CSEFOLD;
}